

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

int __thiscall Fl_Text_Display::rewind_lines(Fl_Text_Display *this,int startPos,int nLines)

{
  Fl_Text_Buffer *this_00;
  int iVar1;
  int retLines;
  int retLineEnd;
  int retLineStart;
  int retPos;
  
  this_00 = this->mBuffer;
  if (this->mContinuousWrap == 0) {
    iVar1 = Fl_Text_Buffer::rewind_lines(this_00,startPos,nLines);
    return iVar1;
  }
  while( true ) {
    iVar1 = Fl_Text_Buffer::line_start(this_00,startPos);
    wrapped_line_counter
              (this,this_00,iVar1,startPos,0x7fffffff,true,0,&retPos,&retLines,&retLineStart,
               &retLineEnd,false);
    if (retLines - nLines != 0 && nLines <= retLines) {
      iVar1 = skip_lines(this,iVar1,retLines - nLines,true);
      return iVar1;
    }
    if (iVar1 < 1) break;
    startPos = iVar1 + -1;
    nLines = nLines + ~retLines;
  }
  return 0;
}

Assistant:

int Fl_Text_Display::rewind_lines(int startPos, int nLines) {
  IS_UTF8_ALIGNED2(buffer(), startPos)

  Fl_Text_Buffer *buf = buffer();
  int pos, lineStart, retLines, retPos, retLineStart, retLineEnd;

  /* If we're not wrapping, use the more efficient BufCountBackwardNLines */
  if (!mContinuousWrap)
    return buf->rewind_lines(startPos, nLines);

  pos = startPos;
  for (;;) {
    lineStart = buf->line_start(pos);
    wrapped_line_counter(buf, lineStart, pos, INT_MAX, true, 0,
                         &retPos, &retLines, &retLineStart, &retLineEnd, false);
    if (retLines > nLines)
      return skip_lines(lineStart, retLines-nLines, true);
    nLines -= retLines;
    pos = lineStart - 1;
    if (pos < 0)
      return 0;
    nLines -= 1;
  }
}